

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback log_callback,void *user_data)

{
  ImVector<unsigned_int> *pIVar1;
  ImVec4 *pIVar2;
  ImVec4 *pIVar3;
  int iVar4;
  ImGuiWindow *pIVar5;
  char *pcVar6;
  ImGuiColorMod *pIVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImGuiContext *pIVar11;
  ImGuiContext *pIVar12;
  char *pcVar13;
  long lVar14;
  
  pIVar11 = GImGui;
  while( true ) {
    if ((pIVar11->CurrentWindowStack).Size < 1) {
      return;
    }
    pIVar5 = pIVar11->CurrentWindow;
    while (pIVar11->CurrentTabBar != (ImGuiTabBar *)0x0) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndTabBar() in \'%s\'",pIVar5->Name);
      }
      EndTabBar();
    }
    while (0 < (pIVar11->CurrentWindow->DC).TreeDepth) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing TreePop() in \'%s\'",pIVar5->Name);
      }
      TreePop();
    }
    while ((int)(pIVar11->CurrentWindow->DC).StackSizesOnBegin.SizeOfGroupStack <
           (pIVar11->GroupStack).Size) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndGroup() in \'%s\'",pIVar5->Name);
      }
      EndGroup();
    }
    iVar4 = (pIVar11->CurrentWindow->IDStack).Size;
    while (1 < iVar4) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopID() in \'%s\'",pIVar5->Name);
      }
      pIVar1 = &GImGui->CurrentWindow->IDStack;
      pIVar1->Size = pIVar1->Size + -1;
      iVar4 = (pIVar11->CurrentWindow->IDStack).Size;
    }
    while (iVar4 = (pIVar11->ColorStack).Size,
          (pIVar11->CurrentWindow->DC).StackSizesOnBegin.SizeOfColorStack < iVar4) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        pcVar6 = pIVar5->Name;
        pcVar13 = GetStyleColorName((pIVar11->ColorStack).Data[(long)iVar4 + -1].Col);
        (*log_callback)(user_data,"Recovered from missing PopStyleColor() in \'%s\' for ImGuiCol_%s"
                        ,pcVar6,pcVar13);
      }
      pIVar12 = GImGui;
      pIVar7 = (GImGui->ColorStack).Data;
      lVar14 = (long)(GImGui->ColorStack).Size;
      pIVar2 = &pIVar7[lVar14 + -1].BackupValue;
      fVar8 = pIVar2->y;
      fVar9 = pIVar2->z;
      fVar10 = pIVar2->w;
      pIVar3 = (GImGui->Style).Colors + pIVar7[lVar14 + -1].Col;
      pIVar3->x = pIVar2->x;
      pIVar3->y = fVar8;
      pIVar3->z = fVar9;
      pIVar3->w = fVar10;
      (pIVar12->ColorStack).Size = (pIVar12->ColorStack).Size + -1;
    }
    while ((int)(pIVar11->CurrentWindow->DC).StackSizesOnBegin.SizeOfStyleVarStack <
           (pIVar11->StyleVarStack).Size) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopStyleVar() in \'%s\'",pIVar5->Name);
      }
      PopStyleVar(1);
    }
    while ((int)(pIVar11->CurrentWindow->DC).StackSizesOnBegin.SizeOfFocusScopeStack <
           (pIVar11->FocusScopeStack).Size) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopFocusScope() in \'%s\'",pIVar5->Name);
      }
      pIVar12 = GImGui;
      iVar4 = (GImGui->FocusScopeStack).Size;
      (GImGui->CurrentWindow->DC).NavFocusScopeIdCurrent =
           (GImGui->FocusScopeStack).Data[(long)iVar4 + -1];
      (pIVar12->FocusScopeStack).Size = iVar4 + -1;
    }
    iVar4 = (pIVar11->CurrentWindowStack).Size;
    if (iVar4 == 1) break;
    if ((pIVar11->CurrentWindow->Flags & 0x1000000) == 0) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing End() for \'%s\'",pIVar5->Name);
      }
      End();
    }
    else {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndChild() for \'%s\'",pIVar5->Name);
      }
      EndChild();
    }
    if (iVar4 == 1) {
      return;
    }
  }
  return;
}

Assistant:

void    ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback log_callback, void* user_data)
{
    // PVS-Studio V1044 is "Loop break conditions do not depend on the number of iterations"
    ImGuiContext& g = *GImGui;
    while (g.CurrentWindowStack.Size > 0)
    {
#ifdef IMGUI_HAS_TABLE
        while (g.CurrentTable && (g.CurrentTable->OuterWindow == g.CurrentWindow || g.CurrentTable->InnerWindow == g.CurrentWindow))
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndTable() in '%s'", g.CurrentTable->OuterWindow->Name);
            EndTable();
        }
#endif
        ImGuiWindow* window = g.CurrentWindow;
        while (g.CurrentTabBar != NULL) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndTabBar() in '%s'", window->Name);
            EndTabBar();
        }
        while (g.CurrentWindow->DC.TreeDepth > 0) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing TreePop() in '%s'", window->Name);
            TreePop();
        }
        while (g.GroupStack.Size > g.CurrentWindow->DC.StackSizesOnBegin.SizeOfGroupStack) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndGroup() in '%s'", window->Name);
            EndGroup();
        }
        while (g.CurrentWindow->IDStack.Size > 1) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopID() in '%s'", window->Name);
            PopID();
        }
        while (g.ColorStack.Size > g.CurrentWindow->DC.StackSizesOnBegin.SizeOfColorStack) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopStyleColor() in '%s' for ImGuiCol_%s", window->Name, GetStyleColorName(g.ColorStack.back().Col));
            PopStyleColor();
        }
        while (g.StyleVarStack.Size > g.CurrentWindow->DC.StackSizesOnBegin.SizeOfStyleVarStack) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopStyleVar() in '%s'", window->Name);
            PopStyleVar();
        }
        while (g.FocusScopeStack.Size > g.CurrentWindow->DC.StackSizesOnBegin.SizeOfFocusScopeStack) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopFocusScope() in '%s'", window->Name);
            PopFocusScope();
        }
        if (g.CurrentWindowStack.Size == 1)
        {
            IM_ASSERT(g.CurrentWindow->IsFallbackWindow);
            break;
        }
        if (g.CurrentWindow->Flags & ImGuiWindowFlags_ChildWindow)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndChild() for '%s'", window->Name);
            EndChild();
        }
        else
        {
            if (log_callback) log_callback(user_data, "Recovered from missing End() for '%s'", window->Name);
            End();
        }
    }
}